

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountOverJoin.cpp
# Opt level: O0

void __thiscall CountOverJoin::run(CountOverJoin *this)

{
  element_type *peVar1;
  Union *pUVar2;
  DTreeNode *dTreeNode;
  DTreeNode *dTreeNode_00;
  ostream *poVar3;
  long in_RDI;
  size_t flatValueCount;
  uint tupleCount;
  unsigned_short numberOfCachedValues;
  int64_t startCount;
  int64_t startJoin;
  Launcher *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  shared_ptr<Engine> *in_stack_fffffffffffffd18;
  CountOverJoin *this_00;
  CountOverJoin *in_stack_fffffffffffffd38;
  string *__val;
  undefined1 *__val_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278 [32];
  string local_258 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218 [32];
  string local_1f8 [8];
  FactorisedJoin *in_stack_fffffffffffffe10;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_170;
  rep local_168;
  duration<long,_std::ratio<1L,_1000L>_> local_160;
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  uint local_f8;
  unsigned_short local_f2;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_f0;
  rep local_e8;
  duration<long,_std::ratio<1L,_1000L>_> local_e0;
  rep local_d8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_c0;
  rep local_b8;
  duration<long,_std::ratio<1L,_1000L>_> local_b0;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_48;
  rep local_40;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  rep local_30;
  undefined1 local_28 [40];
  
  std::__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x19e495);
  __val_00 = local_28;
  Launcher::getAggregateEngine(in_stack_fffffffffffffcf8);
  std::dynamic_pointer_cast<FactorisedJoin,Engine>(in_stack_fffffffffffffd18);
  std::shared_ptr<FactorisedJoin>::operator=
            ((shared_ptr<FactorisedJoin> *)in_stack_fffffffffffffd00,
             (shared_ptr<FactorisedJoin> *)in_stack_fffffffffffffcf8);
  std::shared_ptr<FactorisedJoin>::~shared_ptr((shared_ptr<FactorisedJoin> *)0x19e4e3);
  std::shared_ptr<Engine>::~shared_ptr((shared_ptr<Engine> *)0x19e4ed);
  local_48.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_40 = (rep)std::chrono::
                  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  ::time_since_epoch(&local_48);
  local_38.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                 in_stack_fffffffffffffcf8);
  local_30 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_38);
  std::__shared_ptr_access<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x19e543);
  FactorisedJoin::run(in_stack_fffffffffffffe10);
  peVar1 = std::__shared_ptr_access<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x19e555);
  pUVar2 = FactorisedJoin::getFactorisationRoot(peVar1);
  *(Union **)(in_RDI + 0x58) = pUVar2;
  local_c0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_b8 = (rep)std::chrono::
                  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  ::time_since_epoch(&local_c0);
  local_b0.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                 in_stack_fffffffffffffcf8);
  std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_b0);
  std::__cxx11::to_string((long)__val_00);
  std::operator+((char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  std::operator+(in_stack_fffffffffffffd08,(char *)in_stack_fffffffffffffd00);
  std::operator<<((ostream *)&std::cout,local_68);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  local_f0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_e8 = (rep)std::chrono::
                  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  ::time_since_epoch(&local_f0);
  local_e0.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                 in_stack_fffffffffffffcf8);
  local_d8 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_e0);
  peVar1 = std::__shared_ptr_access<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x19e69d);
  local_f2 = FactorisedJoin::getNumberOfCachedValues(peVar1);
  dTreeNode = (DTreeNode *)((ulong)local_f2 << 2);
  dTreeNode_00 = (DTreeNode *)operator_new__((ulong)dTreeNode);
  memset(dTreeNode_00,0,(size_t)dTreeNode);
  *(DTreeNode **)(in_RDI + 0x60) = dTreeNode_00;
  this_00 = *(CountOverJoin **)(in_RDI + 0x58);
  std::__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x19e6f8);
  local_f8 = count(in_stack_fffffffffffffd38,(Union *)this_00,dTreeNode_00);
  local_170.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_168 = (rep)std::chrono::
                   time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   ::time_since_epoch(&local_170);
  local_160.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffcf8);
  std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_160);
  __val = local_158;
  std::__cxx11::to_string((long)__val_00);
  std::operator+((char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  std::operator+(in_stack_fffffffffffffd08,(char *)in_stack_fffffffffffffd00);
  std::operator<<((ostream *)&std::cout,local_118);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_158);
  *(undefined8 *)(in_RDI + 0x68) = 0;
  memset(*(void **)(in_RDI + 0x60),0,(ulong)local_f2 << 2);
  std::__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x19e827);
  valueCount(this_00,(Union *)dTreeNode_00,dTreeNode);
  std::__cxx11::to_string((unsigned_long)__val);
  std::operator+((char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  std::operator+(in_stack_fffffffffffffd08,(char *)in_stack_fffffffffffffd00);
  std::operator<<((ostream *)&std::cout,local_190);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string(local_1d0);
  __lhs = &local_238;
  std::__cxx11::to_string((unsigned_long)__val);
  std::operator+((char *)__lhs,in_stack_fffffffffffffd00);
  std::operator+(__lhs,(char *)in_stack_fffffffffffffd00);
  std::operator<<((ostream *)&std::cout,local_1f8);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::~string((string *)&local_238);
  __rhs = &local_298;
  std::__cxx11::to_string((double)__lhs);
  std::operator+((char *)__lhs,__rhs);
  std::operator+(__lhs,(char *)__rhs);
  std::operator<<((ostream *)&std::cout,local_258);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string((string *)&local_298);
  poVar3 = std::operator<<((ostream *)&std::cout,"DATA - Number of Tuples in join result: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)local_f8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void CountOverJoin::run() 
{
    _joinEngine =
        std::dynamic_pointer_cast<FactorisedJoin>(_launcher->getAggregateEngine());

#ifdef BENCH
    int64_t startJoin = duration_cast<milliseconds>(
        system_clock::now().time_since_epoch()).count();
#endif

    _joinEngine->run();

    rootNode = _joinEngine->getFactorisationRoot();

    BINFO(
        "WORKER - join construction: " + std::to_string(
            duration_cast<milliseconds>(
                system_clock::now().time_since_epoch()).count() - startJoin
            ) + "ms.\n"
        );

    DINFO("WORKER - join has been constructed. \n");

#ifdef BENCH
    int64_t startCount = duration_cast<milliseconds>(
        system_clock::now().time_since_epoch()).count();
#endif

    unsigned short numberOfCachedValues = _joinEngine->getNumberOfCachedValues();

    cachedCounts = new unsigned int[numberOfCachedValues]();

    unsigned int tupleCount = count(rootNode, _dTree->_root); 

    BINFO(
        "WORKER - count calculation: " + std::to_string(
            duration_cast<milliseconds>(
                system_clock::now().time_since_epoch()).count() - startCount) +
        "ms.\n");


    numberOfValues = 0;
    memset(cachedCounts, 0, numberOfCachedValues * sizeof(unsigned int));
    valueCount(rootNode, _dTree->_root);

    // std::cout << "Number of cached values: "+std::to_string(numberOfCachedValues)+"\n";
    std::cout << "DATA - Number of values in Factorised Representation: "+ std::to_string(numberOfValues) +".\n";

    size_t flatValueCount = ((size_t)tupleCount) * dfdb::params::NUM_OF_ATTRIBUTES;
    std::cout << "DATA - Number of values in Listing Representation: "+std::to_string(flatValueCount)+".\n"; 

    std::cout << "DATA - Compression Factor: "+ std::to_string((double)flatValueCount / numberOfValues)+".\n";

    assert(tupleCount == rootNode -> count);

    std::cout << "DATA - Number of Tuples in join result: " <<
        (size_t) tupleCount << std::endl;
    // exit(0);
}